

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall google::protobuf::internal::MapFieldBase::Clear(MapFieldBase *this)

{
  TaggedPtr TVar1;
  ReflectionPayload *pRVar2;
  
  TVar1 = (this->super_MapFieldBaseForParse).payload_._M_i;
  if ((TVar1 & 1) != 0) {
    pRVar2 = ToPayload(TVar1);
    if (pRVar2 != (ReflectionPayload *)0x0) {
      RepeatedPtrFieldBase::
      Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                ((RepeatedPtrFieldBase *)pRVar2);
    }
  }
  if (*(undefined4 *)((long)&this[1].super_MapFieldBaseForParse.payload_._M_i + 4) != 1) {
    UntypedMapBase::ClearTableImpl((UntypedMapBase *)(this + 1),true);
  }
  TVar1 = (this->super_MapFieldBaseForParse).payload_._M_i;
  if ((TVar1 & 1) != 0) {
    pRVar2 = ToPayload(TVar1);
    if (pRVar2 != (ReflectionPayload *)0x0) {
      (pRVar2->state)._M_i = STATE_MODIFIED_MAP;
    }
  }
  return;
}

Assistant:

void MapFieldBase::Clear() {
  if (ReflectionPayload* p = maybe_payload()) {
    p->repeated_field.Clear();
  }

  ClearMapNoSync();
  // Data in map and repeated field are both empty, but we can't set status
  // CLEAN. Because clear is a generated API, we cannot invalidate previous
  // reference to map.
  SetMapDirty();
}